

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O3

void llama_numa_init(ggml_numa_strategy numa)

{
  long lVar1;
  undefined8 uVar2;
  code *UNRECOVERED_JUMPTABLE;
  
  if (numa == GGML_NUMA_STRATEGY_DISABLED) {
    return;
  }
  lVar1 = ggml_backend_dev_by_type(0);
  if (lVar1 != 0) {
    uVar2 = ggml_backend_dev_backend_reg(lVar1);
    UNRECOVERED_JUMPTABLE =
         (code *)ggml_backend_reg_get_proc_address(uVar2,"ggml_backend_cpu_numa_init");
    (*UNRECOVERED_JUMPTABLE)(numa);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama.cpp",
             0x46,"GGML_ASSERT(%s) failed","dev && \"CPU backend is not loaded\"");
}

Assistant:

void llama_numa_init(enum ggml_numa_strategy numa) {
    if (numa != GGML_NUMA_STRATEGY_DISABLED) {
        auto * dev = ggml_backend_dev_by_type(GGML_BACKEND_DEVICE_TYPE_CPU);
        GGML_ASSERT(dev && "CPU backend is not loaded");
        auto * reg = ggml_backend_dev_backend_reg(dev);
        auto * numa_init_fn = (decltype(ggml_numa_init) *) ggml_backend_reg_get_proc_address(reg, "ggml_backend_cpu_numa_init");
        numa_init_fn(numa);
    }
}